

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot.c
# Opt level: O0

void ecs_snapshot_free(ecs_snapshot_t *snapshot)

{
  int32_t iVar1;
  void *pvVar2;
  undefined8 *puVar3;
  ecs_table_leaf_t *leaf;
  int32_t count;
  int32_t i;
  ecs_table_leaf_t *tables;
  ecs_snapshot_t *snapshot_local;
  
  ecs_sparse_free(snapshot->entity_index);
  pvVar2 = _ecs_vector_first(snapshot->tables,0x18,0x10);
  iVar1 = ecs_vector_count(snapshot->tables);
  for (leaf._4_4_ = 0; leaf._4_4_ < iVar1; leaf._4_4_ = leaf._4_4_ + 1) {
    puVar3 = (undefined8 *)((long)pvVar2 + (long)leaf._4_4_ * 0x18);
    ecs_table_clear_data(snapshot->world,(ecs_table_t *)*puVar3,(ecs_data_t *)puVar3[2]);
    (*ecs_os_api.free_)((void *)puVar3[2]);
  }
  ecs_vector_free(snapshot->tables);
  (*ecs_os_api.free_)(snapshot);
  return;
}

Assistant:

void ecs_snapshot_free(
    ecs_snapshot_t *snapshot)
{
    ecs_sparse_free(snapshot->entity_index);

    ecs_table_leaf_t *tables = ecs_vector_first(snapshot->tables, ecs_table_leaf_t);
    int32_t i, count = ecs_vector_count(snapshot->tables);
    for (i = 0; i < count; i ++) {
        ecs_table_leaf_t *leaf = &tables[i];
        ecs_table_clear_data(snapshot->world, leaf->table, leaf->data);
        ecs_os_free(leaf->data);
    }    

    ecs_vector_free(snapshot->tables);
    ecs_os_free(snapshot);
}